

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017cdd0 = 0x2d2d2d2d2d2d2d;
    uRam000000000017cdd7._0_1_ = '-';
    uRam000000000017cdd7._1_1_ = '-';
    uRam000000000017cdd7._2_1_ = '-';
    uRam000000000017cdd7._3_1_ = '-';
    uRam000000000017cdd7._4_1_ = '-';
    uRam000000000017cdd7._5_1_ = '-';
    uRam000000000017cdd7._6_1_ = '-';
    uRam000000000017cdd7._7_1_ = '-';
    DAT_0017cdc0 = '-';
    DAT_0017cdc0_1._0_1_ = '-';
    DAT_0017cdc0_1._1_1_ = '-';
    DAT_0017cdc0_1._2_1_ = '-';
    DAT_0017cdc0_1._3_1_ = '-';
    DAT_0017cdc0_1._4_1_ = '-';
    DAT_0017cdc0_1._5_1_ = '-';
    DAT_0017cdc0_1._6_1_ = '-';
    uRam000000000017cdc8 = 0x2d2d2d2d2d2d2d;
    DAT_0017cdcf = 0x2d;
    DAT_0017cdb0 = '-';
    DAT_0017cdb0_1._0_1_ = '-';
    DAT_0017cdb0_1._1_1_ = '-';
    DAT_0017cdb0_1._2_1_ = '-';
    DAT_0017cdb0_1._3_1_ = '-';
    DAT_0017cdb0_1._4_1_ = '-';
    DAT_0017cdb0_1._5_1_ = '-';
    DAT_0017cdb0_1._6_1_ = '-';
    uRam000000000017cdb8._0_1_ = '-';
    uRam000000000017cdb8._1_1_ = '-';
    uRam000000000017cdb8._2_1_ = '-';
    uRam000000000017cdb8._3_1_ = '-';
    uRam000000000017cdb8._4_1_ = '-';
    uRam000000000017cdb8._5_1_ = '-';
    uRam000000000017cdb8._6_1_ = '-';
    uRam000000000017cdb8._7_1_ = '-';
    DAT_0017cda0 = '-';
    DAT_0017cda0_1._0_1_ = '-';
    DAT_0017cda0_1._1_1_ = '-';
    DAT_0017cda0_1._2_1_ = '-';
    DAT_0017cda0_1._3_1_ = '-';
    DAT_0017cda0_1._4_1_ = '-';
    DAT_0017cda0_1._5_1_ = '-';
    DAT_0017cda0_1._6_1_ = '-';
    uRam000000000017cda8._0_1_ = '-';
    uRam000000000017cda8._1_1_ = '-';
    uRam000000000017cda8._2_1_ = '-';
    uRam000000000017cda8._3_1_ = '-';
    uRam000000000017cda8._4_1_ = '-';
    uRam000000000017cda8._5_1_ = '-';
    uRam000000000017cda8._6_1_ = '-';
    uRam000000000017cda8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000017cd98._0_1_ = '-';
    uRam000000000017cd98._1_1_ = '-';
    uRam000000000017cd98._2_1_ = '-';
    uRam000000000017cd98._3_1_ = '-';
    uRam000000000017cd98._4_1_ = '-';
    uRam000000000017cd98._5_1_ = '-';
    uRam000000000017cd98._6_1_ = '-';
    uRam000000000017cd98._7_1_ = '-';
    DAT_0017cddf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}